

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  value_type *ppIVar2;
  int i;
  int i_00;
  
  i_00 = 0;
  bVar1 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (!bVar1) {
    return;
  }
  for (; i_00 < windows->Size; i_00 = i_00 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](windows,i_00);
    NodeWindow(*ppIVar2,"Window");
  }
  TreePop();
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
            {
                if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                    return;
                for (int i = 0; i < windows.Size; i++)
                    Funcs::NodeWindow(windows[i], "Window");
                ImGui::TreePop();
            }